

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

CharFormat testing::internal::PrintAsStringLiteralTo(wchar_t c,ostream *os)

{
  ostream *os_local;
  wchar_t c_local;
  
  if (c == L'\"') {
    std::operator<<(os,"\\\"");
    os_local._4_4_ = kSpecialEscape;
  }
  else if (c == L'\'') {
    std::operator<<(os,"\'");
    os_local._4_4_ = kAsIs;
  }
  else {
    os_local._4_4_ = PrintAsCharLiteralTo<wchar_t,wchar_t>(c,os);
  }
  return os_local._4_4_;
}

Assistant:

static CharFormat PrintAsStringLiteralTo(wchar_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo<wchar_t>(c, os);
  }
}